

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QDockAreaLayoutInfo * __thiscall
QMainWindowLayout::dockInfo(QMainWindowLayout *this,QWidget *widget)

{
  QDockWidgetGroupWindow **ppQVar1;
  QDockAreaLayoutInfo *pQVar2;
  QLayout *pQVar3;
  QList<QDockWidgetGroupWindow_*> *__range1;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<QDockWidgetGroupWindow_*> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QDockAreaLayout::info((QDockAreaLayout *)(this + 0x1a0),widget);
  if (pQVar2 == (QDockAreaLayoutInfo *)0x0) {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QDockWidgetGroupWindow **)&DAT_aaaaaaaaaaaaaaaa;
    QObject::findChildren<QDockWidgetGroupWindow*>
              ((QList<QDockWidgetGroupWindow_*> *)&local_48,
               *(QObject **)(*(long *)(this + 8) + 0x10),(FindChildOptions)0x0);
    ppQVar1 = local_48.ptr;
    lVar4 = local_48.size << 3;
    lVar5 = 0;
    do {
      pQVar2 = (QDockAreaLayoutInfo *)0x0;
      if (lVar4 == lVar5) break;
      pQVar3 = QWidget::layout(*(QWidget **)((long)ppQVar1 + lVar5));
      pQVar2 = QDockAreaLayoutInfo::info((QDockAreaLayoutInfo *)&pQVar3[4].super_QLayoutItem,widget)
      ;
      lVar5 = lVar5 + 8;
    } while (pQVar2 == (QDockAreaLayoutInfo *)0x0);
    QArrayDataPointer<QDockWidgetGroupWindow_*>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return pQVar2;
}

Assistant:

QDockAreaLayoutInfo *QMainWindowLayout::dockInfo(QWidget *widget)
{
    QDockAreaLayoutInfo *info = layoutState.dockAreaLayout.info(widget);
    if (info)
        return info;
    const auto groups =
            parent()->findChildren<QDockWidgetGroupWindow*>(Qt::FindDirectChildrenOnly);
    for (QDockWidgetGroupWindow *dwgw : groups) {
        info = dwgw->layoutInfo()->info(widget);
        if (info)
            return info;
    }
    return nullptr;
}